

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O0

void Gudhi::persistence_matrix::swap
               (Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                *col1,Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                      *col2)

{
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *col2_local;
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *col1_local;
  
  swap((Dummy_row_access *)col1,(Dummy_row_access *)col2);
  swap((Dummy_dimension_holder *)col1,(Dummy_dimension_holder *)col2);
  swap((Dummy_chain_properties *)col1,(Dummy_chain_properties *)col2);
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
  ::swap(&col1->column_,&col2->column_);
  std::swap<Gudhi::persistence_fields::Z2_field_operators*>(&col1->operators_,&col2->operators_);
  std::
  swap<Gudhi::persistence_matrix::New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>>*>
            (&col1->entryPool_,&col2->entryPool_);
  return;
}

Assistant:

void swap(Set_column& col1, Set_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }